

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O3

shared_ptr<Type> __thiscall SetElem::check(SetElem *this,shared_ptr<Type> *p1,shared_ptr<Type> *p2)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar3;
  long *in_RCX;
  element_type *peVar4;
  element_type *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *extraout_RDX_00;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  shared_ptr<Type> sVar9;
  
  peVar1 = (p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar6 = false;
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p2;
  }
  else {
    auVar8 = __dynamic_cast(peVar1,&Type::typeinfo,&Array::typeinfo);
    bVar6 = auVar8._0_8_ != 0;
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar8._8_8_;
  }
  peVar3 = (element_type *)*in_RCX;
  if (peVar3 == (element_type *)0x0) {
    bVar7 = false;
  }
  else {
    auVar8 = __dynamic_cast(peVar3,&Type::typeinfo,&Array::typeinfo);
    _Var5._M_pi = auVar8._8_8_;
    bVar7 = auVar8._0_8_ != 0;
  }
  if (!(bool)(bVar6 | bVar7)) {
    if (peVar1 == peVar3) {
      (this->super_Stmt).super_Node._vptr_Node = (_func_int **)peVar3;
      lVar2 = in_RCX[1];
      in_RCX[1] = 0;
      *(long *)&(this->super_Stmt).super_Node.lexline = lVar2;
      *in_RCX = 0;
      goto LAB_00118f26;
    }
    this_00 = (p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    peVar4 = Type::Char.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3 = Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((peVar1 == Type::Char.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
        (peVar1 == Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) ||
       (peVar1 == Type::Float.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RCX;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX[1];
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
          peVar3 = Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar4 = Type::Char.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      bVar6 = true;
      if (((element_type *)_Var5._M_pi != peVar4) && ((element_type *)_Var5._M_pi != peVar3)) {
        bVar6 = (element_type *)_Var5._M_pi ==
                Type::Float.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
      }
    }
    else {
      bVar6 = false;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    }
    if (bVar6) {
      lVar2 = in_RCX[1];
      in_RCX[1] = 0;
      (this->super_Stmt).super_Node._vptr_Node = (_func_int **)*in_RCX;
      *(long *)&(this->super_Stmt).super_Node.lexline = lVar2;
      *in_RCX = 0;
      goto LAB_00118f26;
    }
  }
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Stmt).super_Node.lexline = 0;
LAB_00118f26:
  sVar9.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar9.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Type>)sVar9.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Type> check(std::shared_ptr<Type> p1, std::shared_ptr<Type> p2) {
		Array* arr_left = dynamic_cast<Array*>(p1.get());
		Array* arr_right = dynamic_cast<Array*>(p2.get());
		if (arr_left || arr_right) return nullptr;
		else if (p1 == p2) return p2;
		else if (Type::numeric(p1) && Type::numeric(p2)) return p2;
		else return nullptr;
	}